

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialog::setViewMode(QFileDialog *this,ViewMode mode)

{
  QFileDialogPrivate *this_00;
  
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QFileDialogOptions::setViewMode((ViewMode)(this_00->options).value.ptr);
  if (((this_00->super_QDialogPrivate).nativeDialogInUse == false) &&
     ((this_00->qFileDialogUi).d != (Ui_QFileDialog *)0x0)) {
    if (mode != Detail) {
      QFileDialogPrivate::showListView(this_00);
      return;
    }
    QFileDialogPrivate::showDetailsView(this_00);
    return;
  }
  return;
}

Assistant:

void QFileDialog::setViewMode(QFileDialog::ViewMode mode)
{
    Q_D(QFileDialog);
    d->options->setViewMode(static_cast<QFileDialogOptions::ViewMode>(mode));
    if (!d->usingWidgets())
        return;
    if (mode == Detail)
        d->showDetailsView();
    else
        d->showListView();
}